

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O2

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleIndexArrayNode
          (OpenGEXImporter *this,DDLNode *node,aiScene *param_2)

{
  ulong uVar1;
  undefined8 *puVar2;
  float fVar3;
  aiMesh *paVar4;
  Value *this_00;
  pointer paVar5;
  aiVector3D *paVar6;
  undefined8 uVar7;
  uint32 uVar8;
  DataArrayList *vaList;
  size_t sVar9;
  size_t *psVar10;
  aiFace *paVar11;
  aiVector3D *paVar12;
  aiColor4D *paVar13;
  uint *puVar14;
  DeadlyImportError *pDVar15;
  aiFace *paVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  Value **ppVVar20;
  long lVar21;
  long lVar22;
  allocator<char> local_99;
  OpenGEXImporter *local_98;
  ulong local_90;
  ulong local_88;
  DataArrayList *local_80;
  size_t local_78;
  pointer local_70;
  pointer local_68;
  ulong local_60;
  ulong local_58;
  string local_50;
  
  if (node == (DDLNode *)0x0) {
    pDVar15 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"No parent node for name.",&local_99);
    DeadlyImportError::DeadlyImportError(pDVar15,&local_50);
    __cxa_throw(pDVar15,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_98 = this;
  if (this->m_currentMesh == (aiMesh *)0x0) {
    pDVar15 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"No current mesh for index data found.",&local_99);
    DeadlyImportError::DeadlyImportError(pDVar15,&local_50);
    __cxa_throw(pDVar15,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  vaList = ODDLParser::DDLNode::getDataArrayList(node);
  if (vaList != (DataArrayList *)0x0) {
    sVar9 = countDataArrayListItems(vaList);
    local_98->m_currentMesh->mNumFaces = (uint)sVar9;
    psVar10 = (size_t *)operator_new__(-(ulong)(sVar9 >> 0x3c != 0) | sVar9 * 0x10 | 8);
    *psVar10 = sVar9;
    paVar11 = (aiFace *)(psVar10 + 1);
    if (sVar9 != 0) {
      paVar16 = paVar11;
      do {
        paVar16->mNumIndices = 0;
        paVar16->mIndices = (uint *)0x0;
        paVar16 = paVar16 + 1;
      } while (paVar16 != paVar11 + sVar9);
    }
    local_98->m_currentMesh->mFaces = paVar11;
    local_98->m_currentMesh->mNumVertices = (uint)sVar9 * 3;
    paVar4 = local_98->m_currentMesh;
    uVar18 = (ulong)paVar4->mNumVertices;
    uVar19 = uVar18 * 0xc;
    paVar12 = (aiVector3D *)operator_new__(uVar19);
    if (uVar18 != 0) {
      uVar19 = uVar19 - 0xc;
      memset(paVar12,0,(uVar19 - uVar19 % 0xc) + 0xc);
    }
    paVar4->mVertices = paVar12;
    uVar19 = (local_98->m_currentVertices).m_numColors;
    if (uVar19 != 0) {
      uVar18 = 0xffffffffffffffff;
      if (uVar19 < 0x1000000000000000) {
        uVar18 = uVar19 << 4;
      }
      paVar13 = (aiColor4D *)operator_new__(uVar18);
      memset(paVar13,0,uVar19 << 4);
      local_98->m_currentMesh->mColors[0] = paVar13;
    }
    local_68 = (local_98->m_currentVertices).m_normals.
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_70 = (local_98->m_currentVertices).m_normals.
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
    local_60 = uVar19;
    if (local_68 != local_70) {
      paVar4 = local_98->m_currentMesh;
      uVar18 = (ulong)paVar4->mNumVertices;
      uVar19 = uVar18 * 0xc;
      paVar12 = (aiVector3D *)operator_new__(uVar19);
      if (uVar18 != 0) {
        uVar19 = uVar19 - 0xc;
        memset(paVar12,0,(uVar19 - uVar19 % 0xc) + 0xc);
      }
      paVar4->mNormals = paVar12;
    }
    local_78 = (local_98->m_currentVertices).m_numUVComps[0];
    if (local_78 != 0) {
      paVar4 = local_98->m_currentMesh;
      uVar18 = (ulong)paVar4->mNumVertices;
      uVar19 = uVar18 * 0xc;
      paVar12 = (aiVector3D *)operator_new__(uVar19);
      if (uVar18 != 0) {
        uVar19 = uVar19 - 0xc;
        memset(paVar12,0,(uVar19 - uVar19 % 0xc) + 0xc);
      }
      paVar4->mTextureCoords[0] = paVar12;
    }
    local_90 = 0;
    uVar19 = 0;
    while (uVar19 < local_98->m_currentMesh->mNumFaces) {
      paVar11 = local_98->m_currentMesh->mFaces;
      paVar11[uVar19].mNumIndices = 3;
      local_88 = uVar19;
      puVar14 = (uint *)operator_new__(0xc);
      paVar11[uVar19].mIndices = puVar14;
      ppVVar20 = &vaList->m_dataList;
      local_58 = local_90 & 0xffffffff;
      lVar22 = local_58 * 3 + 2;
      lVar21 = local_58 << 4;
      local_80 = vaList;
      for (uVar18 = 0; uVar1 = local_58 + uVar18, uVar18 < paVar11[uVar19].mNumIndices;
          uVar18 = uVar18 + 1) {
        this_00 = *ppVVar20;
        uVar8 = ODDLParser::Value::getUnsignedInt32(this_00);
        uVar17 = (ulong)(int)uVar8;
        paVar5 = (local_98->m_currentVertices).m_vertices.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)(((long)(local_98->m_currentVertices).m_vertices.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)paVar5) / 0xc) <
            uVar17) {
          __assert_fail("static_cast<size_t>( idx ) <= m_currentVertices.m_vertices.size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/OpenGEX/OpenGEXImporter.cpp"
                        ,0x3a4,
                        "void Assimp::OpenGEX::OpenGEXImporter::handleIndexArrayNode(ODDLParser::DDLNode *, aiScene *)"
                       );
        }
        if (local_98->m_currentMesh->mNumVertices <= uVar1) {
          __assert_fail("index < m_currentMesh->mNumVertices",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/OpenGEX/OpenGEXImporter.cpp"
                        ,0x3a5,
                        "void Assimp::OpenGEX::OpenGEXImporter::handleIndexArrayNode(ODDLParser::DDLNode *, aiScene *)"
                       );
        }
        paVar12 = local_98->m_currentMesh->mVertices;
        fVar3 = paVar5[uVar17].z;
        *(undefined8 *)((long)paVar12 + lVar22 * 4 + -8) = *(undefined8 *)(paVar5 + uVar17);
        (&paVar12->x)[lVar22] = fVar3;
        if (local_60 != 0) {
          paVar13 = (local_98->m_currentVertices).m_colors + uVar17;
          uVar7 = *(undefined8 *)&paVar13->b;
          puVar2 = (undefined8 *)((long)&local_98->m_currentMesh->mColors[0]->r + lVar21);
          *puVar2 = *(undefined8 *)paVar13;
          puVar2[1] = uVar7;
        }
        if (local_68 != local_70) {
          paVar5 = (local_98->m_currentVertices).m_normals.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          paVar12 = local_98->m_currentMesh->mNormals;
          fVar3 = paVar5[uVar17].z;
          *(undefined8 *)((long)paVar12 + lVar22 * 4 + -8) = *(undefined8 *)(paVar5 + uVar17);
          (&paVar12->x)[lVar22] = fVar3;
        }
        if (local_78 != 0) {
          paVar12 = (local_98->m_currentVertices).m_textureCoords[0];
          paVar6 = local_98->m_currentMesh->mTextureCoords[0];
          fVar3 = paVar12[uVar17].z;
          *(undefined8 *)((long)paVar6 + lVar22 * 4 + -8) = *(undefined8 *)(paVar12 + uVar17);
          (&paVar6->x)[lVar22] = fVar3;
        }
        paVar11[uVar19].mIndices[uVar18] = (int)local_90 + (int)uVar18;
        ppVVar20 = &this_00->m_next;
        lVar22 = lVar22 + 3;
        lVar21 = lVar21 + 0x10;
      }
      vaList = local_80->m_next;
      local_90 = uVar1;
      uVar19 = local_88 + 1;
    }
  }
  return;
}

Assistant:

void OpenGEXImporter::handleIndexArrayNode( ODDLParser::DDLNode *node, aiScene * /*pScene*/ ) {
    if( nullptr == node ) {
        throw DeadlyImportError( "No parent node for name." );
        return;
    }

    if( nullptr == m_currentMesh ) {
        throw DeadlyImportError( "No current mesh for index data found." );
        return;
    }

    DataArrayList *vaList = node->getDataArrayList();
    if( nullptr == vaList ) {
        return;
    }

    const size_t numItems( countDataArrayListItems( vaList ) );
    m_currentMesh->mNumFaces = static_cast<unsigned int>(numItems);
    m_currentMesh->mFaces = new aiFace[ numItems ];
    m_currentMesh->mNumVertices = static_cast<unsigned int>(numItems * 3);
    m_currentMesh->mVertices = new aiVector3D[ m_currentMesh->mNumVertices ];
    bool hasColors( false );
    if ( m_currentVertices.m_numColors > 0 ) {
        m_currentMesh->mColors[0] = new aiColor4D[ m_currentVertices.m_numColors ];
        hasColors = true;
    }
    bool hasNormalCoords( false );
    if ( !m_currentVertices.m_normals.empty() ) {
        m_currentMesh->mNormals = new aiVector3D[ m_currentMesh->mNumVertices ];
        hasNormalCoords = true;
    }
    bool hasTexCoords( false );
    if ( m_currentVertices.m_numUVComps[ 0 ] > 0 ) {
        m_currentMesh->mTextureCoords[ 0 ] = new aiVector3D[ m_currentMesh->mNumVertices ];
        hasTexCoords = true;
    }

    unsigned int index( 0 );
    for( size_t i = 0; i < m_currentMesh->mNumFaces; i++ ) {
        aiFace &current(  m_currentMesh->mFaces[ i ] );
        current.mNumIndices = 3;
        current.mIndices = new unsigned int[ current.mNumIndices ];
        Value *next( vaList->m_dataList );
        for( size_t indices = 0; indices < current.mNumIndices; indices++ ) {
            const int idx( next->getUnsignedInt32() );
            ai_assert( static_cast<size_t>( idx ) <= m_currentVertices.m_vertices.size() );
            ai_assert( index < m_currentMesh->mNumVertices );
            aiVector3D &pos = ( m_currentVertices.m_vertices[ idx ] );
            m_currentMesh->mVertices[ index ].Set( pos.x, pos.y, pos.z );
            if ( hasColors ) {
                aiColor4D &col = m_currentVertices.m_colors[ idx ];
                m_currentMesh->mColors[ 0 ][ index ] = col;
            }
            if ( hasNormalCoords ) {
                aiVector3D &normal = ( m_currentVertices.m_normals[ idx ] );
                m_currentMesh->mNormals[ index ].Set( normal.x, normal.y, normal.z );
            }
            if ( hasTexCoords ) {
                aiVector3D &tex = ( m_currentVertices.m_textureCoords[ 0 ][ idx ] );
                m_currentMesh->mTextureCoords[ 0 ][ index ].Set( tex.x, tex.y, tex.z );
            }
            current.mIndices[ indices ] = index;
            index++;

            next = next->m_next;
        }
        vaList = vaList->m_next;
    }
}